

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

int link_get_snd_settle_mode(LINK_HANDLE link,sender_settle_mode *snd_settle_mode)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  sender_settle_mode *snd_settle_mode_local;
  LINK_HANDLE link_local;
  
  if ((link == (LINK_HANDLE)0x0) || (snd_settle_mode == (sender_settle_mode *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"link_get_snd_settle_mode",0x3ca,1,"Bad arguments: link = %p, snd_settle_mode = %p"
                ,link,snd_settle_mode);
    }
    l._4_4_ = 0x3cb;
  }
  else {
    *snd_settle_mode = link->snd_settle_mode;
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int link_get_snd_settle_mode(LINK_HANDLE link, sender_settle_mode* snd_settle_mode)
{
    int result;

    if ((link == NULL) ||
        (snd_settle_mode == NULL))
    {
        LogError("Bad arguments: link = %p, snd_settle_mode = %p",
            link, snd_settle_mode);
        result = MU_FAILURE;
    }
    else
    {
        *snd_settle_mode = link->snd_settle_mode;

        result = 0;
    }

    return result;
}